

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O0

vector<lsp::types::Location,_std::allocator<lsp::types::Location>_> * __thiscall
lsp::XmlParser::getReferences
          (vector<lsp::types::Location,_std::allocator<lsp::types::Location>_>
           *__return_storage_ptr__,XmlParser *this,ReferenceParams *params)

{
  int iVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  element_type *peVar5;
  ShortnameElement *pSVar6;
  string local_2a0;
  undefined1 local_280 [8];
  Location res_1;
  ReferenceElement **ref_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_> *__range2_1;
  string local_208;
  undefined1 local_1e8 [8];
  Location res;
  ReferenceElement **ref;
  iterator __end2;
  iterator __begin2;
  vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_> *__range2;
  ReferenceElement reference;
  elementNotFoundException *e;
  ShortnameElement elem;
  undefined1 local_88 [4];
  uint32_t offset;
  uint32_t local_68;
  uint32_t fileIndex;
  string local_58 [32];
  shared_ptr<lsp::ArxmlStorage> storage;
  ReferenceParams *params_local;
  XmlParser *this_local;
  vector<lsp::types::Location,_std::allocator<lsp::types::Location>_> *results;
  
  storage.super___shared_ptr<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
       = 0;
  std::vector<lsp::types::Location,_std::allocator<lsp::types::Location>_>::vector
            (__return_storage_ptr__);
  std::__cxx11::string::string(local_58,(string *)params);
  getStorageForUri((XmlParser *)&stack0xffffffffffffffc8,(DocumentUri *)this);
  std::__cxx11::string::~string(local_58);
  peVar5 = std::__shared_ptr_access<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&stack0xffffffffffffffc8);
  std::__cxx11::string::string((string *)local_88,(string *)params);
  uVar3 = ArxmlStorage::getFileIndex(peVar5,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  local_68 = uVar3;
  peVar5 = std::__shared_ptr_access<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&stack0xffffffffffffffc8);
  uVar3 = ArxmlStorage::getOffsetFromPosition(peVar5,&params->position,local_68);
  elem.parent._4_4_ = uVar3 + 2;
  ShortnameElement::ShortnameElement((ShortnameElement *)&e);
  peVar5 = std::__shared_ptr_access<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&stack0xffffffffffffffc8);
  pSVar6 = ArxmlStorage::getShortnameByOffset(peVar5,(uint32_t *)((long)&elem.parent + 4),local_68);
  ShortnameElement::operator=((ShortnameElement *)&e,pSVar6);
  if ((config::referenceLinkToParentShortname & 1) == 0) {
    peVar5 = std::__shared_ptr_access<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&stack0xffffffffffffffc8);
    ArxmlStorage::getReferencesByShortname
              ((vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
                *)&__begin2_1,peVar5,(ShortnameElement *)&e);
    __end2_1 = std::
               vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
               ::begin((vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
                        *)&__begin2_1);
    ref_1 = (ReferenceElement **)
            std::
            vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>::
            end((vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
                 *)&__begin2_1);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<const_lsp::ReferenceElement_**,_std::vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>_>
                          *)&ref_1);
      if (!bVar2) break;
      res_1.range.end =
           (Position)
           __gnu_cxx::
           __normal_iterator<const_lsp::ReferenceElement_**,_std::vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>_>
           ::operator*(&__end2_1);
      types::Location::Location((Location *)local_280);
      peVar5 = std::__shared_ptr_access<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&stack0xffffffffffffffc8);
      ArxmlStorage::getUriFromFileIndex_abi_cxx11_
                (&local_2a0,peVar5,*(uint32_t *)(*(long *)res_1.range.end + 0x50));
      std::__cxx11::string::operator=((string *)local_280,(string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      peVar5 = std::__shared_ptr_access<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&stack0xffffffffffffffc8);
      res_1.uri.field_2._8_8_ =
           ArxmlStorage::getPositionFromOffset
                     (peVar5,*(int *)(*(long *)res_1.range.end + 0x20) - 2,
                      *(uint32_t *)(*(long *)res_1.range.end + 0x50));
      peVar5 = std::__shared_ptr_access<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&stack0xffffffffffffffc8);
      iVar1 = *(int *)(*(long *)res_1.range.end + 0x20);
      iVar4 = std::__cxx11::string::length();
      res_1.range.start =
           ArxmlStorage::getPositionFromOffset
                     (peVar5,iVar1 + -1 + iVar4,*(uint32_t *)(*(long *)res_1.range.end + 0x50));
      std::vector<lsp::types::Location,_std::allocator<lsp::types::Location>_>::push_back
                (__return_storage_ptr__,(value_type *)local_280);
      types::Location::~Location((Location *)local_280);
      __gnu_cxx::
      __normal_iterator<const_lsp::ReferenceElement_**,_std::vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>_>
      ::operator++(&__end2_1);
    }
    std::vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>::
    ~vector((vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_> *
            )&__begin2_1);
  }
  else {
    peVar5 = std::__shared_ptr_access<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&stack0xffffffffffffffc8);
    ArxmlStorage::getReferencesByShortname
              ((vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
                *)&__begin2,peVar5,(ShortnameElement *)&e);
    __end2 = std::
             vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>::
             begin((vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
                    *)&__begin2);
    ref = (ReferenceElement **)
          std::vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
          ::end((vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
                 *)&__begin2);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_lsp::ReferenceElement_**,_std::vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>_>
                                  *)&ref);
      if (!bVar2) break;
      res.range.end =
           (Position)
           __gnu_cxx::
           __normal_iterator<const_lsp::ReferenceElement_**,_std::vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>_>
           ::operator*(&__end2);
      types::Location::Location((Location *)local_1e8);
      peVar5 = std::__shared_ptr_access<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&stack0xffffffffffffffc8);
      ArxmlStorage::getUriFromFileIndex_abi_cxx11_
                (&local_208,peVar5,*(uint32_t *)(*(long *)res.range.end + 0x50));
      std::__cxx11::string::operator=((string *)local_1e8,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      peVar5 = std::__shared_ptr_access<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&stack0xffffffffffffffc8);
      res.uri.field_2._8_8_ =
           ArxmlStorage::getPositionFromOffset
                     (peVar5,*(int *)(*(long *)(*(long *)res.range.end + 0x48) + 0x40) - 1,
                      *(uint32_t *)(*(long *)(*(long *)res.range.end + 0x48) + 0x44));
      peVar5 = std::__shared_ptr_access<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&stack0xffffffffffffffc8);
      iVar1 = *(int *)(*(long *)(*(long *)res.range.end + 0x48) + 0x40);
      iVar4 = std::__cxx11::string::length();
      res.range.start =
           ArxmlStorage::getPositionFromOffset
                     (peVar5,iVar1 + -1 + iVar4,
                      *(uint32_t *)(*(long *)(*(long *)res.range.end + 0x48) + 0x44));
      std::vector<lsp::types::Location,_std::allocator<lsp::types::Location>_>::push_back
                (__return_storage_ptr__,(value_type *)local_1e8);
      types::Location::~Location((Location *)local_1e8);
      __gnu_cxx::
      __normal_iterator<const_lsp::ReferenceElement_**,_std::vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>_>
      ::operator++(&__end2);
    }
    std::vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>::
    ~vector((vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_> *
            )&__begin2);
  }
  storage.super___shared_ptr<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
       = 1;
  ShortnameElement::~ShortnameElement((ShortnameElement *)&e);
  std::shared_ptr<lsp::ArxmlStorage>::~shared_ptr
            ((shared_ptr<lsp::ArxmlStorage> *)&stack0xffffffffffffffc8);
  if ((storage.super___shared_ptr<lsp::ArxmlStorage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _7_1_ & 1) == 0) {
    std::vector<lsp::types::Location,_std::allocator<lsp::types::Location>_>::~vector
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<lsp::types::Location> lsp::XmlParser::getReferences(const lsp::types::ReferenceParams &params)
{
    std::vector<lsp::types::Location> results;
    
    auto storage = getStorageForUri(params.textDocument.uri);
    uint32_t fileIndex = storage->getFileIndex(params.textDocument.uri);
    uint32_t offset = storage->getOffsetFromPosition(params.position, fileIndex) + 2;
    lsp::ShortnameElement elem;
    try
    {
        elem = storage->getShortnameByOffset(offset, fileIndex);
    }
    catch(const lsp::elementNotFoundException& e)
    {
        auto reference = storage->getReferenceByOffset(offset, fileIndex);
        elem = helper_getShortnameFromInnerPath(storage, reference, offset);
    }

    if(lsp::config::referenceLinkToParentShortname)
    {
        for(auto &ref: storage->getReferencesByShortname(elem))
        {
            lsp::types::Location res;
            res.uri = storage->getUriFromFileIndex(ref->fileIndex);
            res.range.start = storage->getPositionFromOffset(ref->owner->charOffset - 1, ref->owner->fileIndex);
            res.range.end = storage->getPositionFromOffset(ref->owner->charOffset + ref->owner->name.length() - 1, ref->owner->fileIndex);
            results.push_back(res);
        }
    }
    else
    {
        for(auto &ref: storage->getReferencesByShortname(elem))
        {
            lsp::types::Location res;
            res.uri = storage->getUriFromFileIndex(ref->fileIndex);
            res.range.start = storage->getPositionFromOffset(ref->charOffset - 2, ref->fileIndex);
            res.range.end = storage->getPositionFromOffset(ref->charOffset + ref->targetPath.length() - 1, ref->fileIndex);
            results.push_back(res);
        }
    }
    return results;
}